

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Point2f phyr::uniformSampleDisk(Point2f *pt)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double theta;
  double rad;
  Point2f local_10;
  
  dVar1 = sqrt(*in_RDI);
  dVar3 = in_RDI[1];
  dVar2 = cos(dVar3 * 6.283185307179586);
  dVar3 = sin(dVar3 * 6.283185307179586);
  Point2<double>::Point2(&local_10,dVar1 * dVar2,dVar1 * dVar3);
  return local_10;
}

Assistant:

Point2f uniformSampleDisk(const Point2f& pt) {
    Real rad = std::sqrt(pt.x);
    Real theta = 2 * Pi * pt.y;
    return Point2f(rad * std::cos(theta), rad * std::sin(theta));
}